

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fairprice.cpp
# Opt level: O2

int main(void)

{
  int iVar1;
  ostream *poVar2;
  runtime_error *this;
  char *pcVar3;
  int local_3c;
  int guess;
  
  poVar2 = std::operator<<((ostream *)&std::cout,"-----------------");
  poVar2 = std::endl<char,std::char_traits<char>>(poVar2);
  poVar2 = std::operator<<(poVar2," Fair price game");
  poVar2 = std::endl<char,std::char_traits<char>>(poVar2);
  poVar2 = std::operator<<(poVar2,"-----------------");
  poVar2 = std::endl<char,std::char_traits<char>>(poVar2);
  poVar2 = std::endl<char,std::char_traits<char>>(poVar2);
  poVar2 = std::operator<<(poVar2,"The number to guess is a random one under ");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,0);
  poVar2 = std::operator<<(poVar2," and ");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,1000);
  poVar2 = std::endl<char,std::char_traits<char>>(poVar2);
  std::endl<char,std::char_traits<char>>(poVar2);
  local_3c = 1;
  iVar1 = random_int();
  while( true ) {
    while( true ) {
      while( true ) {
        std::operator<<((ostream *)&std::cout,"Your guess: ");
        std::istream::operator>>((istream *)&std::cin,&guess);
        if ((*(uint *)(std::ios_base::Init::~Init + *(long *)(std::cin + -0x18)) & 2) != 0) {
          this = (runtime_error *)__cxa_allocate_exception(0x10);
          std::runtime_error::runtime_error(this,"Input stream has been closed!");
          __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
        }
        if ((*(uint *)(std::ios_base::Init::~Init + *(long *)(std::cin + -0x18)) & 5) == 0) break;
        poVar2 = std::operator<<((ostream *)&std::cout,"Invalid input. Try again!");
        std::endl<char,std::char_traits<char>>(poVar2);
        std::ios::clear((int)*(undefined8 *)(std::cin + -0x18) + 0x1060e0);
        std::istream::ignore((long)&std::cin,-1);
      }
      if ((uint)guess < 0x3e9) break;
      poVar2 = std::operator<<((ostream *)&std::cout,"Number out of range (range: ");
      poVar2 = (ostream *)std::ostream::operator<<(poVar2,0);
      poVar2 = std::operator<<(poVar2,"-");
      poVar2 = (ostream *)std::ostream::operator<<(poVar2,1000);
      poVar2 = std::operator<<(poVar2,"). Try again.");
      std::endl<char,std::char_traits<char>>(poVar2);
    }
    pcVar3 = "More.";
    if ((iVar1 <= guess) && (pcVar3 = "Less.", guess <= iVar1)) break;
    poVar2 = std::operator<<((ostream *)&std::cout,pcVar3);
    std::endl<char,std::char_traits<char>>(poVar2);
    local_3c = local_3c + 1;
  }
  poVar2 = std::operator<<((ostream *)&std::cout,"That\'s it! The random number was ");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,iVar1);
  poVar2 = std::operator<<(poVar2,".");
  poVar2 = std::endl<char,std::char_traits<char>>(poVar2);
  poVar2 = std::operator<<(poVar2,"You win in ");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,local_3c);
  poVar2 = std::operator<<(poVar2," round");
  pcVar3 = "s.";
  if (local_3c < 2) {
    pcVar3 = ".";
  }
  poVar2 = std::operator<<(poVar2,pcVar3);
  std::endl<char,std::char_traits<char>>(poVar2);
  return 0;
}

Assistant:

int main() {
    std::cout 
        << "-----------------" << std::endl
        << " Fair price game" << std::endl
        << "-----------------" << std::endl
        << std::endl
        << "The number to guess is a random one under " << min << " and " << max << std::endl
        << std::endl;

    const int number = random_int();
    int round = 1;

    while (true) {
        int guess;
        std::cout << "Your guess: ";
        std::cin >> guess;

        if (std::cin.eof()) {
            throw std::runtime_error("Input stream has been closed!");
        } else
        if (std::cin.fail()) {
            std::cout << "Invalid input. Try again!" << std::endl;
            std::cin.clear();
            std::cin.ignore(std::numeric_limits<std::streamsize>::max(), '\n');
        } else {
            if (guess < min || guess > max) {
                std::cout << "Number out of range (range: " << min << "-" << max << "). Try again." << std::endl;
            } else {
                if (guess < number) {
                    std::cout << "More." << std::endl;
                } else
                if (guess > number) {
                    std::cout << "Less." << std::endl;
                } else {
                    std::cout << "That's it! The random number was " << number << "." << std::endl
                        << "You win in " << round << " round" << ((round > 1) ? "s." : ".") << std::endl;
                    break;
                }
                ++round;
            }
        }
    }
    return EXIT_SUCCESS;
}